

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::replaceStreamData
          (QPDFObjectHandle *this,string *data,QPDFObjectHandle *filter,
          QPDFObjectHandle *decode_parms)

{
  uchar *__dest;
  QPDFObjectHandle local_58;
  shared_ptr<Buffer> b;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)data->_M_string_length;
  std::make_shared<Buffer,unsigned_long>((unsigned_long *)&b);
  __dest = Buffer::getBuffer(b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (__dest != (uchar *)0x0) {
    memcpy(__dest,(data->_M_dataplus)._M_p,data->_M_string_length);
  }
  as_stream(&local_58,(typed)this);
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  ::qpdf::Stream::replaceStreamData
            ((Stream *)&local_58,(shared_ptr<Buffer> *)&local_38,filter,decode_parms);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFObjectHandle::replaceStreamData(
    std::string const& data, QPDFObjectHandle const& filter, QPDFObjectHandle const& decode_parms)
{
    auto b = std::make_shared<Buffer>(data.length());
    unsigned char* bp = b->getBuffer();
    if (bp) {
        memcpy(bp, data.c_str(), data.length());
    }
    as_stream(error).replaceStreamData(b, filter, decode_parms);
}